

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_bolelli_2018.h
# Opt level: O3

void __thiscall DRAG<TTA>::PerformLabeling(DRAG<TTA> *this)

{
  long lVar1;
  undefined8 uVar2;
  char cVar3;
  uint uVar4;
  Mat1b *pMVar5;
  Mat1i *pMVar6;
  uint *puVar7;
  uint *puVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  undefined4 uVar15;
  ulong uVar16;
  int iVar18;
  uint uVar19;
  uint uVar20;
  long lVar21;
  ulong uVar22;
  long lVar23;
  uint uVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  ulong uVar31;
  uint local_e8;
  Mat local_90 [96];
  ulong uVar17;
  
  pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  uVar11 = *(uint *)&pMVar5->field_0x8;
  uVar10 = (ulong)uVar11;
  iVar18 = *(int *)&pMVar5->field_0xc;
  lVar25 = (long)iVar18;
  cv::Mat::Mat(local_90,**(int **)&pMVar5->field_0x40,(*(int **)&pMVar5->field_0x40)[1],4);
  cv::Mat::operator=(&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat,
                     local_90);
  cv::Mat::~Mat(local_90);
  uVar2 = *(undefined8 *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x8;
  TTA::Alloc((((int)((ulong)uVar2 >> 0x20) + 1) / 2) * (((int)uVar2 + 1) / 2) + 1);
  *TTA::rtable_ = 0;
  TTA::length_ = 1;
  uVar19 = 1;
  if (0 < (int)uVar11) {
    uVar16 = 0;
    do {
      if (0 < iVar18) {
        pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
        pMVar6 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
        lVar12 = **(long **)&pMVar5->field_0x48;
        lVar13 = lVar12 * uVar16 + *(long *)&pMVar5->field_0x10;
        lVar26 = lVar13 - lVar12;
        lVar21 = lVar26 - lVar12;
        lVar12 = lVar12 + lVar13;
        lVar27 = **(long **)&pMVar6->field_0x48;
        lVar28 = lVar27 * uVar16 + *(long *)&pMVar6->field_0x10;
        lVar23 = lVar28 + lVar27 * -2;
        lVar27 = lVar21 + -1;
        uVar22 = uVar16 | 1;
        uVar31 = 0;
        do {
          if (*(char *)(lVar13 + uVar31) == '\0') {
            if ((uVar22 < uVar10) && (*(char *)(lVar12 + uVar31) != '\0')) {
              uVar9 = uVar31 | 1;
              if (((long)uVar9 < lVar25) && (*(char *)(lVar13 + uVar9) != '\0')) {
                if (uVar31 != 0) {
                  if (*(char *)((uVar31 - 1) + lVar13) != '\0') {
                    if (uVar16 != 0) {
                      if (*(char *)(lVar26 + uVar9) == '\0') goto LAB_0011f730;
                      goto LAB_0011f623;
                    }
                    goto LAB_0011fc00;
                  }
                  if (*(char *)(lVar12 + -1 + uVar31) == '\0') goto LAB_0011f6d4;
                  if (uVar16 == 0) goto LAB_0011fc00;
                  if (*(char *)(lVar26 + uVar9) == '\0') {
                    if ((lVar25 <= (long)(uVar31 + 2)) || (*(char *)(lVar26 + uVar31 + 2) == '\0'))
                    {
                      if (*(char *)(lVar26 + uVar31) == '\0') goto LAB_0011fc00;
                      cVar3 = *(char *)((uVar31 - 2) + lVar13);
                      goto joined_r0x0011fbf5;
                    }
                    if (*(char *)(lVar21 + uVar9) == '\0') {
                      if (*(char *)(lVar26 + uVar31) == '\0') goto LAB_0011f763;
                      if (*(char *)(lVar13 + -2 + uVar31) == '\0') {
                        uVar19 = TTA::Merge(*(uint *)(lVar23 + uVar31 * 4),
                                            *(uint *)(lVar23 + 8 + uVar31 * 4));
                        uVar20 = *(uint *)(lVar28 + -8 + uVar31 * 4);
                      }
                      else {
                        if (*(char *)(lVar26 + -1 + uVar31) == '\0') goto LAB_0011fc2f;
                        uVar19 = *(uint *)(lVar23 + -8 + uVar31 * 4);
                        uVar20 = *(uint *)(lVar23 + 8 + uVar31 * 4);
                      }
                      uVar19 = TTA::Merge(uVar19,uVar20);
                      *(uint *)(lVar28 + uVar31 * 4) = uVar19;
                      goto LAB_0011fc09;
                    }
                  }
                  if (*(char *)((uVar31 - 2) + lVar13) == '\0') goto LAB_0011fab9;
LAB_0011f7ab:
                  if (uVar31 != 0 && uVar16 != 0) {
                    if (*(char *)(lVar26 + -1 + uVar31) != '\0') {
LAB_0011f979:
                      if (uVar16 != 0) {
                        if (*(char *)(lVar26 + uVar31) != '\0') goto LAB_0011f8cb;
                        goto LAB_0011f81e;
                      }
                      goto LAB_0011f9c9;
                    }
LAB_0011f7cf:
                    if (*(char *)(lVar26 + -2 + uVar31) != '\0') {
                      if (*(char *)(lVar27 + uVar31) != '\0') goto LAB_0011f979;
                      goto LAB_0011f9c9;
                    }
                  }
                  goto LAB_0011fa73;
                }
                uVar9 = 1;
LAB_0011f6d4:
                if (((uVar16 != 0) && ((long)uVar9 < lVar25)) && (*(char *)(lVar26 + uVar9) != '\0')
                   ) goto LAB_0011f88b;
                if ((uVar16 == 0) || (lVar25 <= (long)(uVar31 + 2))) {
                  if (uVar16 == 0) goto LAB_0011f8fe;
                }
                else if (*(char *)(lVar26 + uVar31 + 2) != '\0') {
                  if (*(char *)(lVar26 + uVar31) == '\0') goto LAB_0011fa2f;
                  goto LAB_0011f860;
                }
                if (*(char *)(lVar26 + uVar31) != '\0') goto LAB_0011f88b;
              }
              else if ((uVar31 != 0) &&
                      ((*(char *)((uVar31 - 1) + lVar12) != '\0' ||
                       (*(char *)(lVar13 + -1 + uVar31) != '\0')))) goto LAB_0011fc00;
LAB_0011f8fe:
              uVar9 = (ulong)TTA::length_;
              TTA::rtable_[uVar9] = TTA::length_;
              TTA::next_[uVar9] = 0xffffffff;
              TTA::tail_[TTA::length_] = TTA::length_;
              uVar19 = TTA::length_ + 1;
              *(uint *)(lVar28 + uVar31 * 4) = TTA::length_;
              TTA::length_ = uVar19;
            }
            else {
              uVar9 = uVar31 | 1;
              if ((long)uVar9 < lVar25) {
                if (*(char *)(lVar13 + uVar9) != '\0') goto LAB_0011f6d4;
                if ((uVar22 < uVar10) && (*(char *)(lVar12 + uVar9) != '\0')) goto LAB_0011f8fe;
              }
              *(undefined4 *)(lVar28 + uVar31 * 4) = 0;
            }
          }
          else if (uVar31 == 0) {
LAB_0011f7f0:
            uVar9 = uVar31 | 1;
            if ((uVar16 == 0) || ((lVar25 <= (long)uVar9 || (*(char *)(lVar26 + uVar9) == '\0')))) {
              if (((long)uVar9 < lVar25) &&
                 (((*(char *)(lVar13 + uVar9) != '\0' && (uVar16 != 0)) &&
                  ((long)(uVar31 + 2) < lVar25)))) {
                if (*(char *)(lVar26 + uVar31 + 2) != '\0') {
                  if (*(char *)(lVar26 + uVar31) == '\0') {
                    if ((uVar31 == 0) || (*(char *)(lVar26 + -1 + uVar31) == '\0')) {
LAB_0011fa2f:
                      uVar19 = *(uint *)(lVar23 + 8 + uVar31 * 4);
                      goto LAB_0011fc05;
                    }
                    if (*(char *)(lVar21 + uVar9) == '\0') goto LAB_0011fa25;
                    goto LAB_0011f81e;
                  }
LAB_0011f860:
                  if ((lVar25 <= (long)uVar9) || (*(char *)(lVar21 + uVar9) == '\0')) {
                    uVar19 = *(uint *)(lVar23 + uVar31 * 4);
                    goto LAB_0011f874;
                  }
                  goto LAB_0011f88b;
                }
              }
              else if (uVar16 == 0) goto LAB_0011f8fe;
              if (*(char *)(lVar26 + uVar31) != '\0') goto LAB_0011f88b;
              if ((uVar16 == 0 || uVar31 == 0) || (*(char *)(lVar26 + -1 + uVar31) == '\0'))
              goto LAB_0011f8fe;
            }
            else {
              if (((*(char *)(lVar26 + uVar31) != '\0') || (uVar31 == 0)) ||
                 (*(char *)(lVar26 + -1 + uVar31) == '\0')) {
LAB_0011f88b:
                uVar19 = *(uint *)(lVar23 + uVar31 * 4);
                goto LAB_0011fc05;
              }
LAB_0011f81e:
              if (*(char *)(lVar21 + uVar31) == '\0') {
LAB_0011f9c9:
                uVar19 = *(uint *)(lVar23 + -8 + uVar31 * 4);
                uVar20 = *(uint *)(lVar23 + uVar31 * 4);
LAB_0011fac2:
                uVar19 = TTA::Merge(uVar19,uVar20);
                goto LAB_0011fc05;
              }
            }
LAB_0011f8cb:
            uVar19 = *(uint *)(lVar23 + -8 + uVar31 * 4);
LAB_0011fc05:
            *(uint *)(lVar28 + uVar31 * 4) = uVar19;
          }
          else {
            if (*(char *)(lVar13 + -1 + uVar31) == '\0') {
              if ((uVar10 <= uVar22) || (*(char *)(lVar12 + -1 + uVar31) == '\0'))
              goto LAB_0011f7f0;
              uVar9 = uVar31 | 1;
              if (((uVar16 == 0) || (lVar25 <= (long)uVar9)) || (*(char *)(lVar26 + uVar9) == '\0'))
              {
                if (((lVar25 <= (long)uVar9) || (*(char *)(lVar13 + uVar9) == '\0')) ||
                   ((uVar16 == 0 ||
                    ((lVar25 <= (long)(uVar31 + 2) || (*(char *)(lVar26 + uVar31 + 2) == '\0'))))))
                {
                  if (uVar16 == 0) goto LAB_0011fc00;
                  if (*(char *)(lVar26 + -1 + uVar31) == '\0') {
                    if (*(char *)(lVar26 + uVar31) == '\0') goto LAB_0011fc00;
                    if (*(char *)((uVar31 - 2) + lVar13) == '\0') goto LAB_0011fab9;
                    goto LAB_0011fa4d;
                  }
                  uVar19 = *(uint *)(lVar23 + -8 + uVar31 * 4);
                  if (*(char *)(lVar13 + -2 + uVar31) != '\0') goto LAB_0011fa6a;
                  uVar20 = *(uint *)(lVar28 + -8 + uVar31 * 4);
LAB_0011fb23:
                  uVar19 = TTA::Merge(uVar19,uVar20);
                  *(uint *)(lVar28 + uVar31 * 4) = uVar19;
                  goto LAB_0011fc09;
                }
                if (*(char *)(lVar13 + -2 + uVar31) == '\0') {
                  if (*(char *)(lVar26 + uVar31) != '\0') {
                    uVar19 = *(uint *)(lVar23 + uVar31 * 4);
                    if (*(char *)(lVar21 + uVar9) == '\0') {
                      uVar20 = *(uint *)(lVar23 + 8 + uVar31 * 4);
                      goto LAB_0011fc9f;
                    }
                    goto LAB_0011fbcf;
                  }
                  if (*(char *)(lVar26 + -1 + uVar31) == '\0') goto LAB_0011f763;
                  if (*(char *)(lVar21 + uVar9) != '\0') goto LAB_0011fafc;
                  uVar19 = TTA::Merge(*(uint *)(lVar23 + -8 + uVar31 * 4),
                                      *(uint *)(lVar23 + 8 + uVar31 * 4));
                  uVar20 = *(uint *)(lVar28 + -8 + uVar31 * 4);
                  goto LAB_0011fac2;
                }
                if (*(char *)(lVar26 + -1 + uVar31) == '\0') {
                  if (*(char *)(lVar21 + uVar9) != '\0') goto LAB_0011f7cf;
                  if (*(char *)(lVar26 + uVar31) != '\0') {
LAB_0011fc2f:
                    lVar1 = uVar31 - 2;
                    if ((uVar31 == 0 || uVar16 == 0) || (*(char *)(lVar26 + lVar1) == '\0')) {
                      uVar19 = TTA::Merge(*(uint *)(lVar23 + uVar31 * 4),
                                          *(uint *)(lVar23 + 8 + uVar31 * 4));
                      uVar20 = *(uint *)(lVar28 + lVar1 * 4);
                      goto LAB_0011fac2;
                    }
                    if (*(char *)(lVar27 + uVar31) == '\0') {
                      uVar19 = TTA::Merge(*(uint *)(lVar23 + uVar31 * 4),
                                          *(uint *)(lVar23 + 8 + uVar31 * 4));
                      uVar20 = *(uint *)(lVar28 + lVar1 * 4);
                    }
                    else {
                      uVar19 = *(uint *)(lVar23 + lVar1 * 4);
                      uVar20 = *(uint *)(lVar23 + 8 + uVar31 * 4);
                    }
                    goto LAB_0011fa7f;
                  }
LAB_0011f763:
                  uVar19 = *(uint *)(lVar23 + 8 + uVar31 * 4);
                  goto LAB_0011fabd;
                }
                if (*(char *)(lVar21 + uVar9) != '\0') goto LAB_0011f979;
LAB_0011fa25:
                uVar19 = *(uint *)(lVar23 + -8 + uVar31 * 4);
LAB_0011f874:
                uVar20 = *(uint *)(lVar23 + 8 + uVar31 * 4);
                goto LAB_0011fac2;
              }
              if (*(char *)((uVar31 - 2) + lVar13) != '\0') goto LAB_0011f7ab;
              if ((*(char *)(lVar26 + uVar31) != '\0') || (*(char *)(lVar26 + -1 + uVar31) == '\0'))
              goto LAB_0011fab9;
LAB_0011fafc:
              if ((uVar16 == 0) || (*(char *)(lVar21 + uVar31) == '\0')) {
                uVar19 = *(uint *)(lVar23 + -8 + uVar31 * 4);
                uVar20 = *(uint *)(lVar23 + uVar31 * 4);
LAB_0011fc9f:
                uVar19 = TTA::Merge(uVar19,uVar20);
                uVar20 = *(uint *)(lVar28 + -8 + uVar31 * 4);
              }
              else {
                uVar19 = *(uint *)(lVar23 + -8 + uVar31 * 4);
LAB_0011fbcf:
                uVar20 = *(uint *)(lVar28 + -8 + uVar31 * 4);
              }
            }
            else {
              uVar9 = uVar31 | 1;
              if (((uVar16 == 0) || (lVar25 <= (long)uVar9)) || (*(char *)(lVar26 + uVar9) == '\0'))
              {
                if (((long)uVar9 < lVar25) && (*(char *)(lVar13 + uVar9) != '\0')) {
LAB_0011f730:
                  if ((uVar16 != 0) &&
                     (((long)(uVar31 + 2) < lVar25 && (*(char *)(lVar26 + uVar31 + 2) != '\0')))) {
                    if (*(char *)(lVar21 + 1 + uVar31) == '\0') goto LAB_0011f763;
                    goto LAB_0011f623;
                  }
                }
LAB_0011fc00:
                uVar19 = *(uint *)(lVar28 + -8 + uVar31 * 4);
                goto LAB_0011fc05;
              }
LAB_0011f623:
              if (*(char *)(lVar26 + uVar31) != '\0') goto LAB_0011f88b;
              cVar3 = *(char *)(lVar21 + uVar31);
joined_r0x0011fbf5:
              if (cVar3 == '\0') {
LAB_0011fab9:
                uVar19 = *(uint *)(lVar23 + uVar31 * 4);
LAB_0011fabd:
                uVar20 = *(uint *)(lVar28 + -8 + uVar31 * 4);
                goto LAB_0011fac2;
              }
              if (uVar31 != 0 && uVar16 != 0) {
                if (*(char *)(lVar26 + -1 + uVar31) != '\0') goto LAB_0011f8cb;
LAB_0011fa4d:
                if (*(char *)(lVar26 + -2 + uVar31) != '\0') {
                  uVar19 = *(uint *)(lVar23 + -8 + uVar31 * 4);
                  if (*(char *)(lVar27 + uVar31) == '\0') {
                    uVar20 = *(uint *)(lVar23 + uVar31 * 4);
                    goto LAB_0011fb23;
                  }
LAB_0011fa6a:
                  *(uint *)(lVar28 + uVar31 * 4) = uVar19;
                  goto LAB_0011fc09;
                }
              }
LAB_0011fa73:
              uVar19 = *(uint *)(lVar23 + uVar31 * 4);
              uVar20 = *(uint *)(lVar28 + (uVar31 - 2) * 4);
            }
LAB_0011fa7f:
            uVar19 = TTA::Merge(uVar19,uVar20);
            *(uint *)(lVar28 + uVar31 * 4) = uVar19;
          }
LAB_0011fc09:
          uVar31 = uVar31 + 2;
        } while ((long)uVar31 < lVar25);
      }
      puVar7 = TTA::rtable_;
      uVar16 = uVar16 + 2;
    } while ((int)uVar16 < (int)uVar11);
    uVar19 = 1;
    if (1 < TTA::length_) {
      uVar10 = 1;
      do {
        if (uVar10 == puVar7[uVar10]) {
          uVar19 = uVar19 + 1;
          uVar11 = uVar19;
        }
        else {
          uVar11 = puVar7[puVar7[uVar10]];
        }
        puVar7[uVar10] = uVar11;
        uVar10 = uVar10 + 1;
      } while (uVar10 < TTA::length_);
    }
  }
  (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar19;
  puVar7 = TTA::rtable_;
  pMVar6 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  uVar11 = *(uint *)&pMVar6->field_0x8;
  uVar20 = uVar11 & 0xfffffffe;
  uVar19 = *(uint *)&pMVar6->field_0xc;
  local_e8 = uVar19 & 0x80000001;
  uVar16 = (long)(int)uVar19 & 0xfffffffffffffffe;
  uVar10 = 0;
  iVar18 = (int)uVar16;
  if (0 < (int)uVar20) {
    pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
    lVar12 = *(long *)&pMVar5->field_0x10;
    lVar13 = **(long **)&pMVar5->field_0x48;
    lVar21 = *(long *)&pMVar6->field_0x10;
    lVar23 = **(long **)&pMVar6->field_0x48;
    lVar25 = lVar21 + lVar23;
    lVar27 = lVar12 + 1 + lVar13;
    lVar28 = lVar12 + 1;
    uVar22 = 0;
    lVar26 = lVar21;
    do {
      puVar8 = TTA::rtable_;
      lVar14 = lVar23 * uVar22 + lVar21;
      lVar1 = lVar14 + lVar23;
      if (iVar18 < 1) {
        uVar31 = 0;
      }
      else {
        uVar31 = 0;
        do {
          lVar29 = (long)*(int *)(lVar26 + uVar31 * 4);
          if (lVar29 < 1) {
            *(undefined8 *)(lVar26 + uVar31 * 4) = 0;
            uVar9 = uVar31 + 1;
            *(undefined4 *)(lVar25 + uVar31 * 4) = 0;
            uVar15 = 0;
          }
          else {
            uVar4 = puVar8[lVar29];
            uVar24 = uVar4;
            if (*(char *)(lVar28 + -1 + uVar31) == '\0') {
              uVar24 = 0;
            }
            *(uint *)(lVar26 + uVar31 * 4) = uVar24;
            uVar9 = uVar31 | 1;
            uVar24 = uVar4;
            if (*(char *)(lVar28 + uVar31) == '\0') {
              uVar24 = 0;
            }
            *(uint *)(lVar26 + 4 + uVar31 * 4) = uVar24;
            uVar24 = uVar4;
            if (*(char *)(lVar27 + -1 + uVar31) == '\0') {
              uVar24 = 0;
            }
            *(uint *)(lVar25 + uVar31 * 4) = uVar24;
            uVar17 = (ulong)uVar4;
            if (*(char *)(lVar27 + uVar31) == '\0') {
              uVar17 = uVar10;
            }
            uVar15 = (undefined4)uVar17;
          }
          *(undefined4 *)(lVar1 + uVar9 * 4) = uVar15;
          uVar31 = uVar31 + 2;
        } while ((long)uVar31 < (long)uVar16);
      }
      if (local_e8 == 1) {
        lVar29 = (long)*(int *)(lVar14 + uVar31 * 4);
        if (lVar29 < 1) {
          *(undefined4 *)(lVar14 + uVar31 * 4) = 0;
          *(undefined4 *)(lVar1 + uVar31 * 4) = 0;
        }
        else {
          lVar30 = lVar13 * uVar22 + lVar12;
          uVar4 = puVar7[lVar29];
          uVar9 = (ulong)uVar4;
          if (*(char *)(lVar30 + uVar31) == '\0') {
            uVar9 = uVar10;
          }
          *(int *)(lVar14 + uVar31 * 4) = (int)uVar9;
          if (*(char *)(lVar30 + lVar13 + uVar31) == '\0') {
            *(undefined4 *)(lVar1 + uVar31 * 4) = 0;
          }
          else {
            *(uint *)(lVar1 + uVar31 * 4) = uVar4;
          }
        }
      }
      uVar22 = uVar22 + 2;
      lVar25 = lVar25 + lVar23 * 2;
      lVar27 = lVar27 + lVar13 * 2;
      lVar28 = lVar28 + lVar13 * 2;
      lVar26 = lVar26 + lVar23 * 2;
    } while (uVar22 < uVar20);
    uVar10 = uVar22 & 0xffffffff;
  }
  puVar7 = TTA::rtable_;
  if ((uVar11 & 0x80000001) == 1) {
    pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
    lVar25 = *(long *)&pMVar5->field_0x10;
    lVar13 = **(long **)&pMVar5->field_0x48 * uVar10;
    lVar27 = *(long *)&pMVar6->field_0x10;
    lVar12 = uVar10 * **(long **)&pMVar6->field_0x48;
    if (iVar18 < 1) {
      uVar10 = 0;
    }
    else {
      lVar21 = lVar13 + lVar25;
      lVar23 = lVar12 + lVar27;
      uVar10 = 0;
      do {
        lVar26 = (long)*(int *)(lVar23 + uVar10 * 4);
        if (lVar26 < 1) {
          *(undefined8 *)(lVar23 + uVar10 * 4) = 0;
        }
        else {
          uVar11 = puVar7[lVar26];
          uVar20 = uVar11;
          if (*(char *)(lVar21 + uVar10) == '\0') {
            uVar20 = 0;
          }
          *(uint *)(lVar23 + uVar10 * 4) = uVar20;
          if (*(char *)(lVar21 + 1 + uVar10) == '\0') {
            *(undefined4 *)(lVar23 + 4 + uVar10 * 4) = 0;
          }
          else {
            *(uint *)(lVar23 + 4 + uVar10 * 4) = uVar11;
          }
        }
        uVar10 = uVar10 + 2;
      } while (uVar10 < ((long)(int)uVar19 & 0xfffffffeU));
    }
    if (local_e8 == 1) {
      lVar27 = lVar27 + lVar12;
      lVar12 = (long)*(int *)(lVar27 + uVar10 * 4);
      uVar11 = 0;
      if ((0 < lVar12) && (uVar11 = 0, *(char *)(lVar25 + lVar13 + uVar10) != '\0')) {
        uVar11 = TTA::rtable_[lVar12];
      }
      *(uint *)(lVar27 + uVar10 * 4) = uVar11;
    }
  }
  TTA::Dealloc();
  return;
}

Assistant:

void PerformLabeling()
    {
        const int h = img_.rows;
        const int w = img_.cols;

        img_labels_ = cv::Mat1i(img_.size()); // Memory allocation for the output image

        LabelsSolver::Alloc(UPPER_BOUND_8_CONNECTIVITY); // Memory allocation of the labels solver
        LabelsSolver::Setup(); // Labels solver initialization

                               // We work with 2x2 blocks
                               // +-+-+-+
                               // |P|Q|R|
                               // +-+-+-+
                               // |S|X|
                               // +-+-+

                               // The pixels are named as follows
                               // +---+---+---+
                               // |a b|c d|e f|
                               // |g h|i j|k l|
                               // +---+---+---+
                               // |m n|o p|
                               // |q r|s t|
                               // +---+---+

                               // Pixels a, f, l, q are not needed, since we need to understand the
                               // the connectivity between these blocks and those pixels only matter
                               // when considering the outer connectivities

                               // A bunch of defines used to check if the pixels are foreground,
                               // without going outside the image limits.

                               // First scan
        for (int r = 0; r < h; r += 2) {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(r);
            const unsigned char* const img_row_prev = (unsigned char *)(((char *)img_row) - img_.step.p[0]);
            const unsigned char* const img_row_prev_prev = (unsigned char *)(((char *)img_row_prev) - img_.step.p[0]);
            const unsigned char* const img_row_fol = (unsigned char *)(((char *)img_row) + img_.step.p[0]);
            unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
            unsigned* const img_labels_row_prev_prev = (unsigned *)(((char *)img_labels_row) - img_labels_.step.p[0] - img_labels_.step.p[0]);

            for (int c = 0; c < w; c += 2) {

#define CONDITION_B c-1>=0 && r-2>=0 && img_row_prev_prev[c-1]>0
#define CONDITION_C r-2>=0 && img_row_prev_prev[c]>0
#define CONDITION_D c+1<w && r-2>=0 && img_row_prev_prev[c+1]>0
#define CONDITION_E c+2<w && r-2>=0 && img_row_prev_prev[c+2]>0

#define CONDITION_G c-2>=0 && r-1>=0 && img_row_prev[c-2]>0
#define CONDITION_H c-1>=0 && r-1>=0 && img_row_prev[c-1]>0
#define CONDITION_I r-1>=0 && img_row_prev[c]>0
#define CONDITION_J c+1<w && r-1>=0 && img_row_prev[c+1]>0
#define CONDITION_K c+2<w && r-1>=0 && img_row_prev[c+2]>0

#define CONDITION_M c-2>=0 && img_row[c-2]>0
#define CONDITION_N c-1>=0 && img_row[c-1]>0
#define CONDITION_O img_row[c]>0
#define CONDITION_P c+1<w && img_row[c+1]>0

#define CONDITION_R c-1>=0 && r+1<h && img_row_fol[c-1]>0
#define CONDITION_S r+1<h && img_row_fol[c]>0
#define CONDITION_T c+1<w && r+1<h && img_row_fol[c+1]>0

                // Action 1: No action
#define ACTION_1 img_labels_row[c] = 0; continue; 
                // Action 2: New label (the block has foreground pixels and is not connected to anything else)
#define ACTION_2 img_labels_row[c] = LabelsSolver::NewLabel(); continue; 
                //Action 3: Assign label of block P
#define ACTION_3 img_labels_row[c] = img_labels_row_prev_prev[c - 2]; continue;
                // Action 4: Assign label of block Q 
#define ACTION_4 img_labels_row[c] = img_labels_row_prev_prev[c]; continue;
                // Action 5: Assign label of block R
#define ACTION_5 img_labels_row[c] = img_labels_row_prev_prev[c + 2]; continue;
                // Action 6: Assign label of block S
#define ACTION_6 img_labels_row[c] = img_labels_row[c - 2]; continue; 
                // Action 7: Merge labels of block P and Q
#define ACTION_7 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]); continue;
                //Action 8: Merge labels of block P and R
#define ACTION_8 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c + 2]); continue;
                // Action 9 Merge labels of block P and S
#define ACTION_9 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row[c - 2]); continue;
                // Action 10 Merge labels of block Q and R
#define ACTION_10 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row_prev_prev[c + 2]); continue;
                // Action 11: Merge labels of block Q and S
#define ACTION_11 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row[c - 2]); continue;
                // Action 12: Merge labels of block R and S
#define ACTION_12 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c + 2], img_labels_row[c - 2]); continue;
                // Action 13: not used
#define ACTION_13 
                // Action 14: Merge labels of block P, Q and S
#define ACTION_14 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]), img_labels_row[c - 2]); continue;
                //Action 15: Merge labels of block P, R and S
#define ACTION_15 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c + 2]), img_labels_row[c - 2]); continue;
                //Action 16: labels of block Q, R and S
#define ACTION_16 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row_prev_prev[c + 2]), img_labels_row[c - 2]); continue;

#include "labeling_bolelli_2018_drag.inc.h"
            }
        }

        // Second scan
        n_labels_ = LabelsSolver::Flatten();

        int e_rows = img_labels_.rows & 0xfffffffe;
        bool o_rows = img_labels_.rows % 2 == 1;
        int e_cols = img_labels_.cols & 0xfffffffe;
        bool o_cols = img_labels_.cols % 2 == 1;

        int r = 0;
        for (; r < e_rows; r += 2) {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(r);
            const unsigned char* const img_row_fol = (unsigned char *)(((char *)img_row) + img_.step.p[0]);

            unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
            unsigned* const img_labels_row_fol = (unsigned *)(((char *)img_labels_row) + img_labels_.step.p[0]);
            int c = 0;
            for (; c < e_cols; c += 2) {
                int iLabel = img_labels_row[c];
                if (iLabel > 0) {
                    iLabel = LabelsSolver::GetLabel(iLabel);
                    if (img_row[c] > 0)
                        img_labels_row[c] = iLabel;
                    else
                        img_labels_row[c] = 0;
                    if (img_row[c + 1] > 0)
                        img_labels_row[c + 1] = iLabel;
                    else
                        img_labels_row[c + 1] = 0;
                    if (img_row_fol[c] > 0)
                        img_labels_row_fol[c] = iLabel;
                    else
                        img_labels_row_fol[c] = 0;
                    if (img_row_fol[c + 1] > 0)
                        img_labels_row_fol[c + 1] = iLabel;
                    else
                        img_labels_row_fol[c + 1] = 0;
                }
                else {
                    img_labels_row[c] = 0;
                    img_labels_row[c + 1] = 0;
                    img_labels_row_fol[c] = 0;
                    img_labels_row_fol[c + 1] = 0;
                }
            }
            // Last column if the number of columns is odd
            if (o_cols) {
                int iLabel = img_labels_row[c];
                if (iLabel > 0) {
                    iLabel = LabelsSolver::GetLabel(iLabel);
                    if (img_row[c] > 0)
                        img_labels_row[c] = iLabel;
                    else
                        img_labels_row[c] = 0;
                    if (img_row_fol[c] > 0)
                        img_labels_row_fol[c] = iLabel;
                    else
                        img_labels_row_fol[c] = 0;
                }
                else {
                    img_labels_row[c] = 0;
                    img_labels_row_fol[c] = 0;
                }
            }
        }
        // Last row if the number of rows is odd
        if (o_rows) {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(r);
            unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
            int c = 0;
            for (; c < e_cols; c += 2) {
                int iLabel = img_labels_row[c];
                if (iLabel > 0) {
                    iLabel = LabelsSolver::GetLabel(iLabel);
                    if (img_row[c] > 0)
                        img_labels_row[c] = iLabel;
                    else
                        img_labels_row[c] = 0;
                    if (img_row[c + 1] > 0)
                        img_labels_row[c + 1] = iLabel;
                    else
                        img_labels_row[c + 1] = 0;
                }
                else {
                    img_labels_row[c] = 0;
                    img_labels_row[c + 1] = 0;
                }
            }
            // Last column if the number of columns is odd
            if (o_cols) {
                int iLabel = img_labels_row[c];
                if (iLabel > 0) {
                    iLabel = LabelsSolver::GetLabel(iLabel);
                    if (img_row[c] > 0)
                        img_labels_row[c] = iLabel;
                    else
                        img_labels_row[c] = 0;
                }
                else {
                    img_labels_row[c] = 0;
                }
            }
        }

        LabelsSolver::Dealloc();

#undef ACTION_1
#undef ACTION_2
#undef ACTION_3
#undef ACTION_4
#undef ACTION_5
#undef ACTION_6
#undef ACTION_7
#undef ACTION_8
#undef ACTION_9
#undef ACTION_10
#undef ACTION_11
#undef ACTION_12
#undef ACTION_13
#undef ACTION_14
#undef ACTION_15
#undef ACTION_16


#undef CONDITION_B
#undef CONDITION_C
#undef CONDITION_D
#undef CONDITION_E

#undef CONDITION_G
#undef CONDITION_H
#undef CONDITION_I
#undef CONDITION_J
#undef CONDITION_K

#undef CONDITION_M
#undef CONDITION_N
#undef CONDITION_O
#undef CONDITION_P

#undef CONDITION_R
#undef CONDITION_S
#undef CONDITION_T
    }